

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::BayesianProbitRegressor::MergePartialFromCodedStream
          (BayesianProbitRegressor *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  string *psVar6;
  BayesianProbitRegressor_FeatureWeight *value;
  BayesianProbitRegressor_Gaussian *value_00;
  char *field_name;
  char cVar7;
  uint uVar8;
  int size;
  ulong uVar9;
  pointer data;
  
LAB_0022e1ac:
  pbVar3 = input->buffer_;
  uVar5 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar9 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar8 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar5 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
      goto LAB_0022e4a0;
      uVar9 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar9 = uVar9 | 0x100000000;
  }
  else {
LAB_0022e4a0:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar9 = 0;
    if (uVar5 - 1 < 0x3fff) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar5 | uVar9;
  }
  uVar5 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) == 0) goto switchD_0022e24a_caseD_4;
  cVar7 = (char)uVar9;
  switch((uint)(uVar9 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar7 != '\b') break;
    bVar4 = google::protobuf::io::CodedInputStream::ReadVarint32(input,&this->numberoffeatures_);
    goto LAB_0022e22a;
  case 2:
    if (cVar7 == '\x12') {
      value_00 = mutable_bias(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor_Gaussian>
                        (input,value_00);
      goto LAB_0022e22a;
    }
    break;
  case 3:
    if (cVar7 == '\x1a') {
      value = google::protobuf::
              RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::Add
                        (&this->features_);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                        (input,value);
      goto LAB_0022e22a;
    }
    break;
  case 10:
    if (cVar7 != 'R') break;
    psVar6 = mutable_regressioninputfeaturename_abi_cxx11_(this);
    bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar4) {
      return false;
    }
    psVar6 = (this->regressioninputfeaturename_).ptr_;
    data = (psVar6->_M_dataplus)._M_p;
    size = (int)psVar6->_M_string_length;
    field_name = "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName";
LAB_0022e491:
    bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name)
    ;
    if (!bVar4) {
      return false;
    }
    goto LAB_0022e1ac;
  case 0xb:
    if (cVar7 == 'Z') {
      psVar6 = mutable_optimisminputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->optimisminputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName";
      goto LAB_0022e491;
    }
    break;
  case 0xc:
    if (cVar7 == 'b') {
      psVar6 = mutable_samplingscaleinputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->samplingscaleinputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName";
      goto LAB_0022e491;
    }
    break;
  case 0xd:
    if (cVar7 == 'j') {
      psVar6 = mutable_samplingtruncationinputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->samplingtruncationinputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"
      ;
      goto LAB_0022e491;
    }
    break;
  case 0x14:
    if (cVar7 == -0x5e) {
      psVar6 = mutable_meanoutputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->meanoutputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName";
      goto LAB_0022e491;
    }
    break;
  case 0x15:
    if (cVar7 == -0x56) {
      psVar6 = mutable_varianceoutputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->varianceoutputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName";
      goto LAB_0022e491;
    }
    break;
  case 0x16:
    if (cVar7 == -0x4e) {
      psVar6 = mutable_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->pessimisticprobabilityoutputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = 
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName";
      goto LAB_0022e491;
    }
    break;
  case 0x17:
    if (cVar7 == -0x46) {
      psVar6 = mutable_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar4) {
        return false;
      }
      psVar6 = (this->sampledprobabilityoutputfeaturename_).ptr_;
      data = (psVar6->_M_dataplus)._M_p;
      size = (int)psVar6->_M_string_length;
      field_name = 
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName";
      goto LAB_0022e491;
    }
  }
switchD_0022e24a_caseD_4:
  if (uVar5 == 0) {
    return true;
  }
  if ((uVar5 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_0022e22a:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_0022e1ac;
}

Assistant:

bool BayesianProbitRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 numberOfFeatures = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &numberoffeatures_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_features()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string regressionInputFeatureName = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_regressioninputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string optimismInputFeatureName = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_optimisminputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingScaleInputFeatureName = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingscaleinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string samplingTruncationInputFeatureName = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_samplingtruncationinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string meanOutputFeatureName = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_meanoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string varianceOutputFeatureName = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_varianceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string pessimisticProbabilityOutputFeatureName = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_pessimisticprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string sampledProbabilityOutputFeatureName = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_sampledprobabilityoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor)
  return false;
#undef DO_
}